

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_curves.c
# Opt level: O0

int ecp_use_curve25519(mbedtls_ecp_group *grp)

{
  size_t sVar1;
  int local_14;
  int ret;
  mbedtls_ecp_group *grp_local;
  
  local_14 = mbedtls_mpi_read_string(&grp->A,0x10,"01DB42");
  if ((((local_14 == 0) && (local_14 = mbedtls_mpi_lset(&grp->P,1), local_14 == 0)) &&
      (local_14 = mbedtls_mpi_shift_l(&grp->P,0xff), local_14 == 0)) &&
     (local_14 = mbedtls_mpi_sub_int(&grp->P,&grp->P,0x13), local_14 == 0)) {
    sVar1 = mbedtls_mpi_bitlen(&grp->P);
    grp->pbits = sVar1;
    local_14 = mbedtls_mpi_lset(&(grp->G).X,9);
    if ((local_14 == 0) && (local_14 = mbedtls_mpi_lset(&(grp->G).Z,1), local_14 == 0)) {
      mbedtls_mpi_free(&(grp->G).Y);
      grp->nbits = 0xfe;
    }
  }
  if (local_14 != 0) {
    mbedtls_ecp_group_free(grp);
  }
  return local_14;
}

Assistant:

static int ecp_use_curve25519( mbedtls_ecp_group *grp )
{
    int ret;

    /* Actually ( A + 2 ) / 4 */
    MBEDTLS_MPI_CHK( mbedtls_mpi_read_string( &grp->A, 16, "01DB42" ) );

    /* P = 2^255 - 19 */
    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &grp->P, 1 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l( &grp->P, 255 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_int( &grp->P, &grp->P, 19 ) );
    grp->pbits = mbedtls_mpi_bitlen( &grp->P );

    /* Y intentionaly not set, since we use x/z coordinates.
     * This is used as a marker to identify Montgomery curves! */
    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &grp->G.X, 9 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &grp->G.Z, 1 ) );
    mbedtls_mpi_free( &grp->G.Y );

    /* Actually, the required msb for private keys */
    grp->nbits = 254;

cleanup:
    if( ret != 0 )
        mbedtls_ecp_group_free( grp );

    return( ret );
}